

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts3ReadEndBlockField(sqlite3_stmt *pStmt,int iCol,i64 *piEndBlock,i64 *pnByte)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  
  pbVar1 = sqlite3_column_text(pStmt,iCol);
  if (pbVar1 != (byte *)0x0) {
    bVar4 = *pbVar1;
    if ((byte)(bVar4 - 0x30) < 10) {
      uVar5 = 0;
      lVar3 = 0;
      do {
        lVar3 = (ulong)(bVar4 & 0xf) + lVar3 * 10;
        bVar4 = pbVar1[uVar5 + 1];
        uVar5 = uVar5 + 1;
      } while ((byte)(bVar4 - 0x30) < 10);
      uVar5 = uVar5 & 0xffffffff;
    }
    else {
      uVar5 = 0;
      lVar3 = 0;
    }
    *piEndBlock = lVar3;
    for (; pbVar1[uVar5] == 0x20; uVar5 = uVar5 + 1) {
    }
    if (pbVar1[uVar5] == 0x2d) {
      uVar5 = uVar5 + 1;
      lVar3 = -1;
    }
    else {
      lVar3 = 1;
    }
    bVar4 = pbVar1[(int)uVar5];
    if ((byte)(bVar4 - 0x30) < 10) {
      pbVar1 = pbVar1 + (int)uVar5;
      lVar2 = 0;
      do {
        pbVar1 = pbVar1 + 1;
        lVar2 = (ulong)(bVar4 & 0xf) + lVar2 * 10;
        bVar4 = *pbVar1;
      } while ((byte)(bVar4 - 0x30) < 10);
    }
    else {
      lVar2 = 0;
    }
    *pnByte = lVar2 * lVar3;
  }
  return;
}

Assistant:

static void fts3ReadEndBlockField(
  sqlite3_stmt *pStmt, 
  int iCol, 
  i64 *piEndBlock,
  i64 *pnByte
){
  const unsigned char *zText = sqlite3_column_text(pStmt, iCol);
  if( zText ){
    int i;
    int iMul = 1;
    i64 iVal = 0;
    for(i=0; zText[i]>='0' && zText[i]<='9'; i++){
      iVal = iVal*10 + (zText[i] - '0');
    }
    *piEndBlock = iVal;
    while( zText[i]==' ' ) i++;
    iVal = 0;
    if( zText[i]=='-' ){
      i++;
      iMul = -1;
    }
    for(/* no-op */; zText[i]>='0' && zText[i]<='9'; i++){
      iVal = iVal*10 + (zText[i] - '0');
    }
    *pnByte = (iVal * (i64)iMul);
  }
}